

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O0

void __thiscall QPDF::dumpHSharedObject(QPDF *this)

{
  HSharedObjectEntry *pHVar1;
  pointer pMVar2;
  element_type *peVar3;
  element_type *peVar4;
  Pipeline *pPVar5;
  qpdf_offset_t i_00;
  HSharedObjectEntry *pHVar6;
  shared_ptr<Pipeline> local_78;
  shared_ptr<Pipeline> local_68;
  shared_ptr<Pipeline> local_58;
  reference local_48;
  HSharedObjectEntry *se;
  size_t i;
  shared_ptr<Pipeline> local_28;
  HSharedObject *local_18;
  HSharedObject *t;
  QPDF *this_local;
  
  t = (HSharedObject *)this;
  pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  local_18 = &pMVar2->shared_object_hints;
  pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  peVar3 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      pMVar2);
  QPDFLogger::getInfo((QPDFLogger *)&local_28,SUB81(peVar3,0));
  peVar4 = std::__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     ((__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &local_28);
  pPVar5 = Pipeline::operator<<(peVar4,"first_shared_obj: ");
  pPVar5 = Pipeline::operator<<(pPVar5,local_18->first_shared_obj);
  pPVar5 = Pipeline::operator<<(pPVar5,"\n");
  pPVar5 = Pipeline::operator<<(pPVar5,"first_shared_offset: ");
  i_00 = adjusted_offset(this,local_18->first_shared_offset);
  pPVar5 = Pipeline::operator<<(pPVar5,i_00);
  pPVar5 = Pipeline::operator<<(pPVar5,"\n");
  pPVar5 = Pipeline::operator<<(pPVar5,"nshared_first_page: ");
  pPVar5 = Pipeline::operator<<(pPVar5,local_18->nshared_first_page);
  pPVar5 = Pipeline::operator<<(pPVar5,"\n");
  pPVar5 = Pipeline::operator<<(pPVar5,"nshared_total: ");
  pPVar5 = Pipeline::operator<<(pPVar5,local_18->nshared_total);
  pPVar5 = Pipeline::operator<<(pPVar5,"\n");
  pPVar5 = Pipeline::operator<<(pPVar5,"nbits_nobjects: ");
  pPVar5 = Pipeline::operator<<(pPVar5,local_18->nbits_nobjects);
  pPVar5 = Pipeline::operator<<(pPVar5,"\n");
  pPVar5 = Pipeline::operator<<(pPVar5,"min_group_length: ");
  pPVar5 = Pipeline::operator<<(pPVar5,local_18->min_group_length);
  pPVar5 = Pipeline::operator<<(pPVar5,"\n");
  pPVar5 = Pipeline::operator<<(pPVar5,"nbits_delta_group_length: ");
  pPVar5 = Pipeline::operator<<(pPVar5,local_18->nbits_delta_group_length);
  Pipeline::operator<<(pPVar5,"\n");
  std::shared_ptr<Pipeline>::~shared_ptr(&local_28);
  se = (HSharedObjectEntry *)0x0;
  while( true ) {
    pHVar1 = se;
    pHVar6 = (HSharedObjectEntry *)toS<int>(&local_18->nshared_total);
    if (pHVar6 <= pHVar1) break;
    local_48 = std::vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>::at
                         (&local_18->entries,(size_type)se);
    pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    peVar3 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )pMVar2);
    QPDFLogger::getInfo((QPDFLogger *)&local_58,SUB81(peVar3,0));
    peVar4 = std::__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                       ((__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &local_58);
    pPVar5 = Pipeline::operator<<(peVar4,"Shared Object ");
    pPVar5 = Pipeline::operator<<(pPVar5,(unsigned_long)se);
    pPVar5 = Pipeline::operator<<(pPVar5,":\n");
    pPVar5 = Pipeline::operator<<(pPVar5,"  group length: ");
    pPVar5 = Pipeline::operator<<(pPVar5,local_48->delta_group_length + local_18->min_group_length);
    Pipeline::operator<<(pPVar5,"\n");
    std::shared_ptr<Pipeline>::~shared_ptr(&local_58);
    if (local_48->signature_present != 0) {
      pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      peVar3 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)pMVar2);
      QPDFLogger::getInfo((QPDFLogger *)&local_68,SUB81(peVar3,0));
      peVar4 = std::__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*((__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         &local_68);
      Pipeline::operator<<(peVar4,"  signature present\n");
      std::shared_ptr<Pipeline>::~shared_ptr(&local_68);
    }
    if (local_48->nobjects_minus_one != 0) {
      pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      peVar3 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)pMVar2);
      QPDFLogger::getInfo((QPDFLogger *)&local_78,SUB81(peVar3,0));
      peVar4 = std::__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*((__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         &local_78);
      pPVar5 = Pipeline::operator<<(peVar4,"  nobjects: ");
      pPVar5 = Pipeline::operator<<(pPVar5,local_48->nobjects_minus_one + 1);
      Pipeline::operator<<(pPVar5,"\n");
      std::shared_ptr<Pipeline>::~shared_ptr(&local_78);
    }
    se = (HSharedObjectEntry *)((long)&se->delta_group_length + 1);
  }
  return;
}

Assistant:

void
QPDF::dumpHSharedObject()
{
    HSharedObject& t = m->shared_object_hints;
    *m->log->getInfo() << "first_shared_obj: " << t.first_shared_obj << "\n"
                       << "first_shared_offset: " << adjusted_offset(t.first_shared_offset) << "\n"
                       << "nshared_first_page: " << t.nshared_first_page << "\n"
                       << "nshared_total: " << t.nshared_total << "\n"
                       << "nbits_nobjects: " << t.nbits_nobjects << "\n"
                       << "min_group_length: " << t.min_group_length << "\n"
                       << "nbits_delta_group_length: " << t.nbits_delta_group_length << "\n";

    for (size_t i = 0; i < toS(t.nshared_total); ++i) {
        HSharedObjectEntry& se = t.entries.at(i);
        *m->log->getInfo() << "Shared Object " << i << ":\n"
                           << "  group length: " << se.delta_group_length + t.min_group_length
                           << "\n";
        // PDF spec says signature present nobjects_minus_one are always 0, so print them only if
        // they have a non-zero value.
        if (se.signature_present) {
            *m->log->getInfo() << "  signature present\n";
        }
        if (se.nobjects_minus_one != 0) {
            *m->log->getInfo() << "  nobjects: " << se.nobjects_minus_one + 1 << "\n";
        }
    }
}